

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O2

cJSON_bool cJSON_PrintPreallocated(cJSON *item,char *buf,int len,cJSON_bool fmt)

{
  cJSON_bool cVar1;
  long in_FS_OFFSET;
  printbuffer local_48;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.depth = 0;
  cVar1 = 0;
  if (buf != (char *)0x0 && -1 < len) {
    local_48.length = (size_t)(uint)len;
    local_48.offset = 0;
    local_48.noalloc = 1;
    local_48.hooks.allocate = global_hooks.allocate;
    local_48.hooks.deallocate = global_hooks.deallocate;
    local_48.hooks.reallocate = global_hooks.reallocate;
    local_48.buffer = (uchar *)buf;
    local_48.format = fmt;
    cVar1 = print_value(item,&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return cVar1;
  }
  __stack_chk_fail();
}

Assistant:

CJSON_PUBLIC(cJSON_bool) cJSON_PrintPreallocated(cJSON *item, char *buf, const int len, const cJSON_bool fmt)
{
    printbuffer p = { 0, 0, 0, 0, 0, 0, { 0, 0, 0 } };

    if ((len < 0) || (buf == NULL))
    {
        return false;
    }

    p.buffer = (unsigned char*)buf;
    p.length = (size_t)len;
    p.offset = 0;
    p.noalloc = true;
    p.format = fmt;
    p.hooks = global_hooks;

    return print_value(item, &p);
}